

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearConstraint.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::LinearConstraint::evaluateConstraint
          (LinearConstraint *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *constraint)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  undefined4 extraout_var_00;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_RCX;
  Constraint *in_RDI;
  double in_XMM0_Qa;
  iDynTreeEigenConstMatrixMap controlConstraint;
  ostringstream errorMsg_3;
  ostringstream errorMsg_2;
  MatrixDynSize *controlConstraintMatrix;
  bool isValid_1;
  iDynTreeEigenConstMatrixMap stateConstraint;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *stateConstraintMatrix;
  bool isValid;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffff6d8;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffff6e0;
  string *in_stack_fffffffffffff6f0;
  ostream *in_stack_fffffffffffff6f8;
  ostringstream *in_stack_fffffffffffff700;
  ostream *in_stack_fffffffffffff708;
  string local_748 [32];
  ostringstream local_728 [376];
  string local_5b0 [32];
  ostringstream local_590 [376];
  undefined8 local_418;
  byte local_409 [137];
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  undefined8 local_40;
  byte local_31;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *local_30;
  double local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_18 = in_XMM0_Qa;
  if (((ulong)*in_RDI[1]._vptr_Constraint & 1) != 0) {
    local_31 = 0;
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x37e3b0);
    iVar1 = (*peVar2->_vptr_TimeVaryingObject[2])(local_18,peVar2,&local_31);
    local_40 = CONCAT44(extraout_var,iVar1);
    if ((local_31 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar3 = std::operator<<((ostream *)local_1b8,
                               "Unable to retrieve a valid state constraint matrix at time: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      std::operator<<(poVar3,".");
      Constraint::name_abi_cxx11_(in_RDI);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar4,"evaluateConstraint",pcVar5);
      std::__cxx11::string::~string(local_1e8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      goto LAB_0037eb66;
    }
    lVar6 = iDynTree::MatrixDynSize::cols();
    lVar7 = iDynTree::VectorDynSize::size();
    if (lVar6 == lVar7) {
      sVar8 = iDynTree::MatrixDynSize::rows();
      sVar9 = Constraint::constraintSize(in_RDI);
      if (sVar8 != sVar9) goto LAB_0037e58a;
    }
    else {
LAB_0037e58a:
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar3 = std::operator<<((ostream *)local_360,"The state constraint matrix at time: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      std::operator<<(poVar3,
                      " has dimensions not matching with the specified state space dimension or constraint dimension."
                     );
      Constraint::name_abi_cxx11_(in_RDI);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar4,"evaluateConstraint",pcVar5);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::ostringstream::~ostringstream(local_360);
    }
    toEigen((MatrixDynSize *)in_stack_fffffffffffff708);
    toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff6f8,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff6f0);
    toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              (in_stack_fffffffffffff6e0,
               (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)in_stack_fffffffffffff6d8);
  }
  if (((ulong)*in_RDI[1]._vptr_Constraint & 0x100) != 0) {
    local_409[0] = 0;
    peVar2 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x37e76a);
    iVar1 = (*peVar2->_vptr_TimeVaryingObject[2])(local_18,peVar2,local_409);
    local_418 = CONCAT44(extraout_var_00,iVar1);
    if ((local_409[0] & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_590);
      poVar3 = std::operator<<((ostream *)local_590,
                               "Unable to retrieve a valid control constraint matrix at time: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
      std::operator<<(poVar3,".");
      Constraint::name_abi_cxx11_(in_RDI);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar4,"evaluateConstraint",pcVar5);
      std::__cxx11::string::~string(local_5b0);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_590);
      goto LAB_0037eb66;
    }
    lVar6 = iDynTree::MatrixDynSize::cols();
    lVar7 = iDynTree::VectorDynSize::size();
    if (lVar6 == lVar7) {
      sVar8 = iDynTree::MatrixDynSize::rows();
      sVar9 = Constraint::constraintSize(in_RDI);
      if (sVar8 != sVar9) goto LAB_0037e91a;
    }
    else {
LAB_0037e91a:
      in_stack_fffffffffffff700 = local_728;
      std::__cxx11::ostringstream::ostringstream(in_stack_fffffffffffff700);
      in_stack_fffffffffffff708 =
           std::operator<<((ostream *)in_stack_fffffffffffff700,
                           "The control constraint matrix at time: ");
      in_stack_fffffffffffff6f8 =
           (ostream *)std::ostream::operator<<(in_stack_fffffffffffff708,local_18);
      std::operator<<(in_stack_fffffffffffff6f8,
                      " has dimensions not matching with the specified control space dimension or constraint dimension."
                     );
      in_stack_fffffffffffff6f0 = Constraint::name_abi_cxx11_(in_RDI);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError(pcVar4,"evaluateConstraint",pcVar5);
      std::__cxx11::string::~string(local_748);
      std::__cxx11::ostringstream::~ostringstream(local_728);
    }
    toEigen((MatrixDynSize *)in_stack_fffffffffffff708);
    toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
    operator*((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff6f8,
              (MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)in_stack_fffffffffffff6f0);
    toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
    Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
              (in_stack_fffffffffffff6e0,
               (DenseBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)in_stack_fffffffffffff6d8);
  }
  Constraint::constraintSize(in_RDI);
  iDynTree::VectorDynSize::resize((ulong)local_30);
  toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
  toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator+
            ((MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff708,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff700);
  toEigen((VectorDynSize *)in_stack_fffffffffffff6f8);
  Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            (local_30,in_stack_fffffffffffff6d8);
  local_1 = 1;
LAB_0037eb66:
  return (bool)(local_1 & 1);
}

Assistant:

bool LinearConstraint::evaluateConstraint(double time,
                                                  const VectorDynSize& state,
                                                  const VectorDynSize& control,
                                                  VectorDynSize& constraint)
        {
            if (m_pimpl->constrainsState) {
                bool isValid = false;
                const MatrixDynSize& stateConstraintMatrix = m_pimpl->stateConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((stateConstraintMatrix.cols() != state.size()) || (stateConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state constraint matrix at time: " << time << " has dimensions not matching with the specified state space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }
                iDynTree::iDynTreeEigenConstMatrixMap stateConstraint = iDynTree::toEigen(stateConstraintMatrix);

                iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) = stateConstraint * iDynTree::toEigen(state);
            }


            if (m_pimpl->constrainsControl) {
                bool isValid = false;
                const MatrixDynSize& controlConstraintMatrix = m_pimpl->controlConstraintMatrix->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid control constraint matrix at time: " << time << ".";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                    return false;
                }

                if ((controlConstraintMatrix.cols() != control.size()) || (controlConstraintMatrix.rows() != constraintSize())) {
                    std::ostringstream errorMsg;
                    errorMsg << "The control constraint matrix at time: " << time << " has dimensions not matching with the specified control space dimension or constraint dimension.";
                    reportError(name().c_str(), "evaluateConstraint", errorMsg.str().c_str());
                }

                iDynTree::iDynTreeEigenConstMatrixMap controlConstraint = iDynTree::toEigen(controlConstraintMatrix);
                iDynTree::toEigen(m_pimpl->controlConstraintsBuffer) = controlConstraint * iDynTree::toEigen(control);
            }

            constraint.resize(static_cast<unsigned int>(constraintSize()));
            toEigen(constraint) = iDynTree::toEigen(m_pimpl->stateConstraintsBuffer) + iDynTree::toEigen(m_pimpl->controlConstraintsBuffer); //the buffers are zero if not constrained

            return true;

        }